

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyManager.cpp
# Opt level: O2

void __thiscall Node::FindAdd(Node *this,char *part,bool *done,Node **newNode)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  Node *pNVar4;
  char *pcVar5;
  char *pcVar6;
  char *part_00;
  char *pcVar7;
  Node **ppNVar8;
  
  if (*done == false) {
    pcVar2 = this->uri;
    cVar3 = *pcVar2;
    part_00 = part;
    pcVar7 = pcVar2;
    if (cVar3 == *part) {
      while (cVar1 = *part_00, pcVar5 = part, pcVar6 = pcVar2, cVar3 != '\0') {
        if ((cVar1 == '\0') || (pcVar5 = part_00, pcVar6 = pcVar7, cVar3 != cVar1))
        goto LAB_001370a4;
        cVar3 = pcVar7[1];
        part_00 = part_00 + 1;
        pcVar7 = pcVar7 + 1;
      }
      if ((cVar1 == '\0') ||
         (ppNVar8 = this->next, pcVar5 = part_00, pcVar6 = pcVar7, ppNVar8 == (Node **)0x0)) {
LAB_001370a4:
        pNVar4 = Add(this,pcVar6,pcVar5);
        *newNode = pNVar4;
        *done = true;
      }
      else {
        do {
          if (*ppNVar8 == (Node *)0x0) goto LAB_001370a4;
          FindAdd(*ppNVar8,part_00,done,newNode);
          ppNVar8 = ppNVar8 + 1;
        } while (*done == false);
      }
    }
  }
  return;
}

Assistant:

void Node::FindAdd(const char* part, bool *done, class Node ** newNode) {
	if (*done)
		return;
	class Node **nx;
	char *tmp1;
	const char *tmp2;

	tmp1 = uri;
	tmp2 = part;


	//first character is different, we are not interested by this node
	if (*tmp1 != *tmp2)
		return;


//
//	if ( strcmp(tmp1,tmp2) == 0) {
//		*newNode = Add(tmp1, tmp2);
//		*done = true;
//		return;
//	}


//	cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
	while (*tmp1 && *tmp2) {
//		cerr << "----->1aaa tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (*tmp1 == *tmp2) {
			tmp1++;
			tmp2++;
		} else {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl ;
			*newNode = Add(tmp1, tmp2);
			*done = true;
//			if (*newNode == NULL) {cerr << "-----> 1 uposss" << done << endl ; }
			return;
		}
	}

//	cerr << "part: " << part << endl;

	if (*tmp2 != '\0') {
//		cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (next) {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
			nx = next;
			while (*nx != NULL) {
				(*nx)->FindAdd(tmp2, done, newNode);
				if (*done) {
					return;
				}
				nx++;
			}
		}

//		cerr << "----->1 tmp3 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		*newNode = Add(tmp1, tmp2);
		//	if (*newNode == NULL) {cerr << "-----> 3 uposss" << done << endl ; }
		*done = true;
	} else {
//		cerr << "----->3 tmp1 & tmp2: " << uri  << "\t" << part << endl ;
		//if (leaf == NULL) {
//			cerr << "1" << endl;
		*newNode = Add(uri, part);
		*done = true;
//		} else {
//			cerr << "2" << endl;
//			*newNode = this;
//			*done = true;
//		}
	}

}